

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPage::QWizardPage(QWizardPage *this,QWidget *parent)

{
  QWizardPagePrivate *this_00;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWizardPagePrivate *)operator_new(0x318);
  QWizardPagePrivate::QWizardPagePrivate(this_00);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007df950;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QWizardPage_007dfb28;
  QObject::connect((QObject *)&CStack_28,(char *)this,(QObject *)"2completeChanged()",(char *)this,
                   0x66eebd);
  QMetaObject::Connection::~Connection(&CStack_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWizardPage::QWizardPage(QWidget *parent)
    : QWidget(*new QWizardPagePrivate, parent, { })
{
    connect(this, SIGNAL(completeChanged()), this, SLOT(_q_updateCachedCompleteState()));
}